

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O2

Reals __thiscall Omega_h::project_metrics(Omega_h *this,Mesh *mesh,Reals *e2m)

{
  LO nmetrics;
  Int IVar1;
  void *extraout_RDX;
  Write<double> *this_00;
  Reals RVar2;
  Write<double> WStack_68;
  Write<double> local_58;
  Write<double> local_48;
  Write<double> local_38;
  
  this_00 = &WStack_68;
  nmetrics = Mesh::nelems(mesh);
  Write<double>::Write(&local_38,&e2m->write_);
  IVar1 = get_metrics_dim(nmetrics,(Reals *)&local_38);
  Write<double>::~Write(&local_38);
  if (IVar1 == 1) {
    Write<double>::Write(&WStack_68,&e2m->write_);
    project_metrics_dim<1>(this,mesh,(Reals *)&WStack_68);
  }
  else if (IVar1 == 2) {
    this_00 = &local_58;
    Write<double>::Write(this_00,&e2m->write_);
    project_metrics_dim<2>(this,mesh,(Reals *)this_00);
  }
  else {
    if (IVar1 != 3) {
      fail("assertion %s failed at %s +%d\n","false",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_metric.cpp"
           ,0xfb);
    }
    this_00 = &local_48;
    Write<double>::Write(this_00,&e2m->write_);
    project_metrics_dim<3>(this,mesh,(Reals *)this_00);
  }
  Write<double>::~Write(this_00);
  RVar2.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar2.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar2.write_.shared_alloc_;
}

Assistant:

Reals project_metrics(Mesh* mesh, Reals e2m) {
  auto metric_dim = get_metrics_dim(mesh->nelems(), e2m);
  if (metric_dim == 3)
    return project_metrics_dim<3>(mesh, e2m);
  else if (metric_dim == 2)
    return project_metrics_dim<2>(mesh, e2m);
  else if (metric_dim == 1)
    return project_metrics_dim<1>(mesh, e2m);
  else
    OMEGA_H_NORETURN(Reals());
}